

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  float fVar1;
  short sVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiTableInstanceData *pIVar5;
  short *psVar6;
  ImGuiTableColumn *pIVar7;
  long in_RDI;
  float fVar8;
  float fVar9;
  bool pressed;
  bool held;
  ImGuiButtonFlags in_stack_00000014;
  bool hovered;
  ImRect hit_rect;
  ImGuiID column_id;
  float border_y2_hit;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float hit_y2_head;
  float hit_y2_body;
  float hit_y1;
  float hit_half_width;
  ImGuiTableInstanceData *table_instance;
  ImGuiContext *g;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  float in_stack_ffffffffffffffa0;
  float x2;
  float y1;
  float in_stack_ffffffffffffffac;
  uint uVar10;
  undefined4 in_stack_ffffffffffffffb0;
  ImGuiItemFlags in_stack_ffffffffffffffb4;
  ImRect *in_stack_ffffffffffffffb8;
  float id;
  int local_2c;
  
  pIVar3 = GImGui;
  pIVar5 = TableGetInstanceData
                     ((ImGuiTable *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0)
  ;
  ImTrunc(pIVar3->CurrentDpiScale * 4.0);
  if (*(short *)(in_RDI + 0x228) < 1) {
    y1 = *(float *)(in_RDI + 0x114);
  }
  else {
    y1 = *(float *)(in_RDI + 0xf4);
  }
  fVar8 = y1 + *(float *)(in_RDI + 0xe8);
  fVar9 = ImMax<float>(*(float *)(in_RDI + 0xfc),
                       (fVar8 + pIVar5->LastOuterHeight) - *(float *)(in_RDI + 0xe8));
  fVar1 = pIVar5->LastTopHeadersRowHeight;
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x6c); local_2c = local_2c + 1) {
    if ((*(uint *)(*(long *)(in_RDI + 0x48) + (long)(local_2c >> 5) * 4) &
        1 << ((byte)local_2c & 0x1f)) != 0) {
      psVar6 = ImSpan<short>::operator[]((ImSpan<short> *)(in_RDI + 0x28),local_2c);
      sVar2 = *psVar6;
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),(int)sVar2);
      if ((pIVar7->Flags & 0x40000020U) == 0) {
        x2 = fVar9;
        if ((*(uint *)(in_RDI + 4) & 0x800) != 0) {
          x2 = fVar8 + fVar1;
        }
        if ((((*(uint *)(in_RDI + 4) & 0x800) == 0) || ((*(byte *)(in_RDI + 0x23a) & 1) != 0)) &&
           (((pIVar7->IsVisibleX & 1U) != 0 || ((int)*(short *)(in_RDI + 0x214) == (int)sVar2)))) {
          id = x2;
          TableGetColumnResizeID
                    ((ImGuiTable *)CONCAT44(x2,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,
                     in_stack_ffffffffffffff98);
          ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac,y1,x2,in_stack_ffffffffffffffa0);
          ItemAdd((ImRect *)pIVar7,(ImGuiID)id,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
          uVar10 = (uint)in_stack_ffffffffffffffac & 0xffff;
          bVar4 = ButtonBehavior((ImRect *)column,(ImGuiID)border_y2_hit,(bool *)hit_rect.Max,
                                 (bool *)hit_rect.Min,in_stack_00000014);
          in_stack_ffffffffffffffac =
               (float)CONCAT22((short)(uVar10 >> 0x10),CONCAT11(bVar4,(char)uVar10));
          if ((bVar4) && (bVar4 = IsMouseDoubleClicked((ImGuiMouseButton)x2), bVar4)) {
            TableSetColumnWidthAutoSingle
                      ((ImGuiTable *)CONCAT44(x2,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
            ClearActiveID();
            in_stack_ffffffffffffffac =
                 (float)CONCAT13((char)((uint)in_stack_ffffffffffffffac >> 0x18),
                                 (uint3)SUB42(in_stack_ffffffffffffffac,0));
          }
          if (((uint)in_stack_ffffffffffffffac & 0x10000) != 0) {
            if (*(short *)(in_RDI + 0x214) == -1) {
              if (*(short *)(in_RDI + 0x21e) == -1) {
                in_stack_ffffffffffffffa0 = -3.4028235e+38;
              }
              else {
                pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                                   ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),
                                    (int)*(short *)(in_RDI + 0x21e));
                in_stack_ffffffffffffffa0 = pIVar7->MaxX;
              }
              *(float *)(in_RDI + 0xe0) = in_stack_ffffffffffffffa0;
            }
            *(short *)(in_RDI + 0x212) = sVar2;
            *(undefined2 *)(in_RDI + 0x7a) = *(undefined2 *)(in_RDI + 0x78);
          }
          if (((((uint)in_stack_ffffffffffffffac & 0x1000000) != 0) &&
              (0.06 < pIVar3->HoveredIdTimer)) || (((uint)in_stack_ffffffffffffffac & 0x10000) != 0)
             ) {
            *(short *)(in_RDI + 0x20c) = sVar2;
            SetMouseCursor(4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float hit_half_width = ImTrunc(TABLE_RESIZE_SEPARATOR_HALF_THICKNESS * g.CurrentDpiScale);
    const float hit_y1 = (table->FreezeRowsCount >= 1 ? table->OuterRect.Min.y : table->WorkRect.Min.y) + table->AngledHeadersHeight;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table_instance->LastOuterHeight - table->AngledHeadersHeight);
    const float hit_y2_head = hit_y1 + table_instance->LastTopHeadersRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!IM_BITARRAY_TESTBIT(table->EnabledMaskByDisplayOrder, order_n))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        ItemAdd(hit_rect, column_id, NULL, ImGuiItemFlags_NoNav);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}